

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  size_type sVar4;
  undefined8 uVar5;
  reference this_01;
  uint *puVar6;
  const_iterator cStack_58;
  int i_1;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_50;
  const_iterator oi;
  EdgeList *ol;
  const_iterator cStack_38;
  int i;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator ni;
  NodeList *nl;
  uint c;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeLinkDepends *this_local;
  
  fprintf(_stderr,"The strongly connected components are:\n");
  this_00 = cmComputeComponentGraph::GetComponents(this->CCG);
  nl._4_4_ = 0;
  while( true ) {
    sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
    if (sVar4 <= nl._4_4_) break;
    fprintf(_stderr,"Component (%u):\n",(ulong)nl._4_4_);
    ni._M_current =
         (int *)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                          (this_00,(ulong)nl._4_4_);
    local_30._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)ni._M_current);
    while( true ) {
      cStack_38 = std::vector<int,_std::allocator<int>_>::end(ni._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
      if (!bVar2) break;
      puVar6 = (uint *)__gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&local_30);
      pFVar1 = _stderr;
      uVar3 = *puVar6;
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::operator[](&this->EntryList,(long)(int)uVar3);
      uVar5 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  item %d [%s]\n",(ulong)uVar3,uVar5);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    oi._M_current =
         (cmGraphEdge *)cmComputeComponentGraph::GetComponentGraphEdges(this->CCG,nl._4_4_);
    local_50._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)oi._M_current);
    while( true ) {
      cStack_58 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(oi._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_50,&stack0xffffffffffffffa8);
      pFVar1 = _stderr;
      if (!bVar2) break;
      this_01 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&local_50);
      uVar3 = cmGraphEdge::operator_cast_to_int(this_01);
      fprintf(_stderr,"  followed by Component (%d)\n",(ulong)uVar3);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&local_50);
    }
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->ComponentOrder,(ulong)nl._4_4_);
    fprintf(pFVar1,"  topo order index %d\n",(ulong)*puVar6);
    nl._4_4_ = nl._4_4_ + 1;
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void
cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for(unsigned int c=0; c < components.size(); ++c)
    {
    fprintf(stderr, "Component (%u):\n", c);
    NodeList const& nl = components[c];
    for(NodeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
      {
      int i = *ni;
      fprintf(stderr, "  item %d [%s]\n", i,
              this->EntryList[i].Item.c_str());
      }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for(EdgeList::const_iterator oi = ol.begin(); oi != ol.end(); ++oi)
      {
      int i = *oi;
      fprintf(stderr, "  followed by Component (%d)\n", i);
      }
    fprintf(stderr, "  topo order index %d\n",
            this->ComponentOrder[c]);
    }
  fprintf(stderr, "\n");
}